

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_bracket(parse *p)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  cset *cs_00;
  ushort **ppuVar5;
  bool bVar6;
  uint local_28;
  int i_1;
  int ci;
  int i;
  int invert;
  cset *cs;
  parse *p_local;
  
  cs_00 = allocset(p);
  bVar2 = false;
  if ((p->next + 5 < p->end) && (iVar4 = strncmp(p->next,"[:<:]]",6), iVar4 == 0)) {
    doemit(p,0x4c000000,0);
    p->next = p->next + 6;
  }
  else if ((p->next + 5 < p->end) && (iVar4 = strncmp(p->next,"[:>:]]",6), iVar4 == 0)) {
    doemit(p,0x50000000,0);
    p->next = p->next + 6;
  }
  else {
    if ((p->next < p->end) && (*p->next == '^')) {
      p->next = p->next + 1;
      bVar2 = true;
    }
    if ((p->next < p->end) && (*p->next == ']')) {
      p->next = p->next + 1;
      cs_00->ptr[0x5d] = cs_00->ptr[0x5d] | cs_00->mask;
      cs_00->hash = cs_00->hash + ']';
    }
    else if ((p->next < p->end) && (*p->next == '-')) {
      p->next = p->next + 1;
      cs_00->ptr[0x2d] = cs_00->ptr[0x2d] | cs_00->mask;
      cs_00->hash = cs_00->hash + '-';
    }
    while( true ) {
      bVar6 = false;
      if ((p->next < p->end) && (bVar6 = false, *p->next != ']')) {
        bVar6 = false;
        if ((p->next < p->end) &&
           ((bVar6 = false, p->next + 1 < p->end && (bVar6 = false, *p->next == '-')))) {
          bVar6 = p->next[1] == ']';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      if (!bVar6) break;
      p_b_term(p,cs_00);
    }
    if ((p->next < p->end) && (*p->next == '-')) {
      p->next = p->next + 1;
      cs_00->ptr[0x2d] = cs_00->ptr[0x2d] | cs_00->mask;
      cs_00->hash = cs_00->hash + '-';
    }
    if ((p->end <= p->next) || (pcVar1 = p->next, p->next = pcVar1 + 1, *pcVar1 != ']')) {
      seterr(p,7);
    }
    if (p->error == 0) {
      if ((p->g->cflags & 2U) != 0) {
        i_1 = p->g->csetsize;
        while (i_1 = i_1 + -1, -1 < i_1) {
          if (((cs_00->ptr[i_1 & 0xff] & cs_00->mask) != 0) &&
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[i_1] & 0x400) != 0)) {
            cVar3 = othercase(i_1);
            iVar4 = (int)cVar3;
            if (iVar4 != i_1) {
              cs_00->ptr[iVar4] = cs_00->ptr[iVar4] | cs_00->mask;
              cs_00->hash = cs_00->hash + cVar3;
            }
          }
        }
        if (cs_00->multis != (char *)0x0) {
          __assert_fail("cs->multis == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x282,"void p_bracket()");
        }
      }
      if (bVar2) {
        local_28 = p->g->csetsize;
        while (local_28 = local_28 - 1, -1 < (int)local_28) {
          if ((cs_00->ptr[local_28 & 0xff] & cs_00->mask) == 0) {
            cs_00->ptr[(int)local_28] = cs_00->ptr[(int)local_28] | cs_00->mask;
            cs_00->hash = cs_00->hash + (char)local_28;
          }
          else {
            cs_00->ptr[(int)local_28] = cs_00->ptr[(int)local_28] & (cs_00->mask ^ 0xff);
            cs_00->hash = cs_00->hash - (char)local_28;
          }
        }
        if ((p->g->cflags & 8U) != 0) {
          cs_00->ptr[10] = cs_00->ptr[10] & (cs_00->mask ^ 0xff);
          cs_00->hash = cs_00->hash + 0xf6;
        }
        if (cs_00->multis != (char *)0x0) {
          __assert_fail("cs->multis == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x292,"void p_bracket()");
        }
      }
      if (cs_00->multis != (char *)0x0) {
        __assert_fail("cs->multis == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x299,"void p_bracket()");
      }
      iVar4 = nch(p,cs_00);
      if (iVar4 == 1) {
        iVar4 = firstch(p,cs_00);
        ordinary(p,iVar4);
        freeset(p,cs_00);
      }
      else {
        iVar4 = freezeset(p,cs_00);
        doemit(p,0x18000000,(long)iVar4);
      }
    }
  }
  return;
}

Assistant:

static void
p_bracket(p)
struct parse *p;
{
	cset *cs = allocset(p);
	int invert = 0;

	/* Dept of Truly Sickening Special-Case Kludges */
	if (p->next + 5 < p->end && strncmp(p->next, "[:<:]]", 6) == 0) {
		EMIT(OBOW, 0);
		NEXTn(6);
		return;
	}
	if (p->next + 5 < p->end && strncmp(p->next, "[:>:]]", 6) == 0) {
		EMIT(OEOW, 0);
		NEXTn(6);
		return;
	}

	if (EAT('^'))
		invert++;	/* make note to invert set at end */
	if (EAT(']'))
		CHadd(cs, ']');
	else if (EAT('-'))
		CHadd(cs, '-');
	while (MORE() && PEEK() != ']' && !SEETWO('-', ']'))
		p_b_term(p, cs);
	if (EAT('-'))
		CHadd(cs, '-');
	MUSTEAT(']', REG_EBRACK);

	if (p->error != 0)	/* don't mess things up further */
		return;

	if (p->g->cflags&REG_ICASE) {
		int i;
		int ci;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i) && isalpha(i)) {
				ci = othercase(i);
				if (ci != i)
					CHadd(cs, ci);
			}
		assert(cs->multis == NULL);	/* xxx */
#if 0		
		if (cs->multis != NULL)
			mccase(p, cs);
#endif
	}
	if (invert) {
		int i;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i))
				CHsub(cs, i);
			else
				CHadd(cs, i);
		if (p->g->cflags&REG_NEWLINE)
			CHsub(cs, '\n');
		assert(cs->multis == NULL);	/* xxx */
#if 0
		if (cs->multis != NULL)
			mcinvert(p, cs);
#endif
	}

	assert(cs->multis == NULL);		/* xxx */

	if (nch(p, cs) == 1) {		/* optimize singleton sets */
		ordinary(p, firstch(p, cs));
		freeset(p, cs);
	} else
		EMIT(OANYOF, freezeset(p, cs));
}